

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginComboPreview(void)

{
  float *pfVar1;
  ImGuiComboPreviewData *clip_rect_min;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  float fVar7;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((((pIVar3->SkipItems == false) && (((GImGui->LastItemData).StatusFlags & 0x100) != 0)) &&
      (fVar7 = (GImGui->ComboPreviewData).PreviewRect.Min.y, fVar7 < (pIVar3->ClipRect).Max.y)) &&
     (((fVar6 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar1 = &(pIVar3->ClipRect).Min.y,
       *pfVar1 <= fVar6 && fVar6 != *pfVar1 &&
       (clip_rect_min = &GImGui->ComboPreviewData, fVar6 = (pIVar3->ClipRect).Max.x,
       (clip_rect_min->PreviewRect).Min.x <= fVar6 && fVar6 != (clip_rect_min->PreviewRect).Min.x))
      && (fVar6 = (GImGui->ComboPreviewData).PreviewRect.Max.x,
         (pIVar3->ClipRect).Min.x <= fVar6 && fVar6 != (pIVar3->ClipRect).Min.x)))) {
    (GImGui->ComboPreviewData).BackupCursorPos = (pIVar3->DC).CursorPos;
    (pIVar5->ComboPreviewData).BackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
    (pIVar5->ComboPreviewData).BackupCursorPosPrevLine = (pIVar3->DC).CursorPosPrevLine;
    (pIVar5->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    (pIVar5->ComboPreviewData).BackupLayout = (pIVar3->DC).LayoutType;
    IVar2 = (pIVar5->Style).FramePadding;
    fVar6 = (pIVar5->ComboPreviewData).PreviewRect.Min.x + IVar2.x;
    fVar7 = fVar7 + IVar2.y;
    IVar2.y = fVar7;
    IVar2.x = fVar6;
    (pIVar3->DC).CursorPos = IVar2;
    IVar4.y = fVar7;
    IVar4.x = fVar6;
    (pIVar3->DC).CursorMaxPos = IVar4;
    (pIVar3->DC).LayoutType = 0;
    (pIVar3->DC).IsSameLine = false;
    PushClipRect((ImVec2 *)clip_rect_min,&(pIVar5->ComboPreviewData).PreviewRect.Max,true);
    return true;
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible))
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Overlaps(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}